

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O0

void LenPriceEnc_UpdateTable(CLenPriceEnc *p,UInt32 posState,UInt32 *ProbPrices)

{
  uint in_ESI;
  long in_RDI;
  undefined4 in_stack_00000008;
  UInt32 in_stack_00000018;
  UInt32 in_stack_0000001c;
  CLenEnc *in_stack_00000020;
  
  LenEnc_SetPrices(in_stack_00000020,in_stack_0000001c,in_stack_00000018,(UInt32 *)p,
                   (UInt32 *)CONCAT44(posState,in_stack_00000008));
  *(undefined4 *)(in_RDI + 0x4808 + (ulong)in_ESI * 4) = *(undefined4 *)(in_RDI + 0x404);
  return;
}

Assistant:

static void MY_FAST_CALL LenPriceEnc_UpdateTable(CLenPriceEnc *p, UInt32 posState, const UInt32 *ProbPrices)
{
  LenEnc_SetPrices(&p->p, posState, p->tableSize, p->prices[posState], ProbPrices);
  p->counters[posState] = p->tableSize;
}